

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ahocorasick.c
# Opt level: O2

void ac_trie_traverse_setfailure(ACT_NODE_t *node,AC_ALPHABET_t *prefix)

{
  ACT_NODE_t *pAVar1;
  ACT_NODE_t *nod;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  pAVar1 = node->trie->root;
  if (pAVar1 != node) {
    uVar3 = node->depth;
    uVar2 = 1;
    do {
      nod = pAVar1;
      uVar4 = uVar2;
      if (uVar3 <= uVar2) {
        if (node->failure_node != (act_node *)0x0) goto LAB_00107ab7;
        break;
      }
      while ((uVar4 < uVar3 && (nod != (ACT_NODE_t *)0x0))) {
        nod = node_find_next(nod,prefix[uVar4]);
        uVar3 = node->depth;
        uVar4 = uVar4 + 1;
      }
      uVar2 = uVar2 + 1;
    } while (nod == (ACT_NODE_t *)0x0);
    node->failure_node = nod;
  }
LAB_00107ab7:
  lVar5 = 0;
  for (uVar3 = 0; uVar3 < node->outgoing_size; uVar3 = uVar3 + 1) {
    prefix[node->depth] = (&node->outgoing->alpha)[lVar5];
    ac_trie_traverse_setfailure(*(ACT_NODE_t **)((long)&node->outgoing->next + lVar5),prefix);
    lVar5 = lVar5 + 0x10;
  }
  return;
}

Assistant:

static void ac_trie_traverse_setfailure 
    (ACT_NODE_t *node, AC_ALPHABET_t *prefix)
{
    size_t i;
    
    /* In each node, look for its failure node */
    ac_trie_set_failure (node, prefix);
    
    for (i = 0; i < node->outgoing_size; i++)
    {
        prefix[node->depth] = node->outgoing[i].alpha; /* Make the prefix */
        
        /* Recursively call itself to traverse all nodes */
        ac_trie_traverse_setfailure (node->outgoing[i].next, prefix);
    }
}